

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O2

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
ColorTracker::getMaxAreaContour
          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__return_storage_ptr__,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *contours)

{
  pointer pvVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  const_reference __x;
  ProcessingException *this;
  pointer __x_00;
  allocator local_18a;
  allocator local_189;
  vector<double,_std::allocator<double>_> area;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> contour;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __x_00 = (contours->
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (contours->
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x_00 != pvVar1) {
    area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    for (; __x_00 != pvVar1; __x_00 = __x_00 + 1) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                 &contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,
                 __x_00);
      local_150.field_2._M_allocated_capacity = 0;
      local_150._M_dataplus._M_p._0_4_ = 0x8103000c;
      local_150._M_string_length =
           (size_type)
           &contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>;
      local_130._M_dataplus._M_p = (pointer)cv::contourArea((_InputArray *)&local_150,false);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&area,(double *)&local_130)
      ;
      std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                (&contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
    }
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    __x = std::
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ::at(contours,(long)_Var2._M_current -
                        (long)area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
              (__return_storage_ptr__,__x);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&area.super__Vector_base<double,_std::allocator<double>_>);
    return __return_storage_ptr__;
  }
  this = (ProcessingException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,&local_189);
  std::operator+(&local_90,"in ",&local_b0);
  std::operator+(&local_70,&local_90,", at Line ");
  std::__cxx11::to_string(&local_d0,0x110);
  std::operator+(&local_50,&local_70,&local_d0);
  std::operator+(&local_130,&local_50,", ");
  std::__cxx11::string::string((string *)&local_f0,"getMaxAreaContour",&local_18a);
  std::operator+(&local_150,&local_130,&local_f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&contour,
                 &local_150,"(): ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&area,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&contour,
                 "invalid input: given contours list length is 0");
  ProcessingException::ProcessingException(this,(string *)&area);
  __cxa_throw(this,&ProcessingException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

vector<Point> ColorTracker::getMaxAreaContour(const vector<vector<Point>>& contours) noexcept(false){
    if(contours.empty()){
        //cout << "given contours list length is 0" << endl;
        throw ProcessingException(WHERE + "invalid input: given contours list length is 0");
    }
    
    vector<double> area;
    for(vector<Point> contour : contours){
        area.push_back(cv::contourArea(contour));
    }

    auto maxIter = std::max_element(area.begin(),area.end());
    auto maxIndex = std::distance(area.begin(),maxIter);

    return contours.at(maxIndex);
}